

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnectionchannel.cpp
# Opt level: O0

void __thiscall
QHttpNetworkConnectionChannel::checkAndResumeCommunication(QHttpNetworkConnectionChannel *this)

{
  bool bVar1;
  QHttpNetworkConnectionChannel *in_RDI;
  
  if ((in_RDI->reply == (QHttpNetworkReply *)0x0) &&
     (bVar1 = QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::isEmpty
                        ((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
                         in_RDI), bVar1)) {
    abort((QHttpNetworkConnectionChannel *)in_RDI);
  }
  in_RDI->waitingForPotentialAbort = false;
  if ((in_RDI->needInvokeReadyRead & 1U) != 0) {
    _q_readyRead(in_RDI);
  }
  if ((in_RDI->needInvokeReceiveReply & 1U) != 0) {
    _q_receiveReply(in_RDI);
  }
  if ((in_RDI->needInvokeSendRequest & 1U) != 0) {
    sendRequest(in_RDI);
  }
  return;
}

Assistant:

void QHttpNetworkConnectionChannel::checkAndResumeCommunication()
{
    Q_ASSERT(connection->connectionType() == QHttpNetworkConnection::ConnectionTypeHTTP2
             || connection->connectionType() == QHttpNetworkConnection::ConnectionTypeHTTP2Direct);

    // Because HTTP/2 requires that we send a SETTINGS frame as the first thing we do, and respond
    // to a SETTINGS frame with an ACK, we need to delay any handling until we can ensure that any
    // effects from emitting encrypted() have been processed.
    // This function is called after encrypted() was emitted, so check for changes.

    if (!reply && h2RequestsToSend.isEmpty())
        abort();
    waitingForPotentialAbort = false;
    if (needInvokeReadyRead)
        _q_readyRead();
    if (needInvokeReceiveReply)
        _q_receiveReply();
    if (needInvokeSendRequest)
        sendRequest();
}